

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

int symbol_generate(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  char cVar1;
  lgx_ast_node_s **pplVar2;
  lgx_ast_node_t *plVar3;
  lgx_type_function_s *plVar4;
  byte bVar5;
  int iVar6;
  lgx_ast_node_s *plVar7;
  lgx_symbol_t *plVar8;
  undefined8 extraout_RAX;
  lgx_type_t *plVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool is_global;
  lgx_str_t local_48;
  undefined4 local_34;
  
  cVar1 = *(char *)node;
  if (cVar1 != '\x18') {
    uVar14 = 0;
    if (cVar1 == '\x17') {
      if (node->children < 2) {
        __assert_fail("node->children >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17b,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      plVar7 = *node->child;
      if (*(char *)plVar7 != '#') {
        __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17c,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      if (*(char *)node->child[1] != '\"') {
        __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17d,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      local_48.buffer = (ast->lex).source.content + plVar7->offset;
      local_48.length = plVar7->length;
      uVar12 = (ulong)local_48.length;
      local_48.size = 0;
      plVar7 = node->parent;
      if (*(char *)plVar7 == '\x01') {
        plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_CONSTANT,&local_48,
                            plVar7->parent == (lgx_ast_node_s *)0x0);
        if (plVar8 != (lgx_symbol_t *)0x0) {
          plVar9 = &plVar8->type;
          iVar6 = symbol_parse_type(ast,node->child[1],plVar9);
          if (iVar6 == 0) {
            if ((plVar9->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar9), iVar6 != 0))
            goto LAB_0012236e;
            uVar12 = (ulong)local_48.length;
            pcVar11 = "constant %.*s has incomplete type\n";
            goto LAB_0012235b;
          }
        }
      }
      else {
        pcVar11 = "[invalid constant declaration] %.*s\n";
LAB_0012235b:
        symbol_error(ast,node,pcVar11,uVar12,local_48.buffer);
      }
    }
    else {
      if (cVar1 != '\x16') goto LAB_0012236e;
      if (node->children < 2) {
        __assert_fail("node->children >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x128,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      plVar7 = *node->child;
      if (*(char *)plVar7 != '#') {
        __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x129,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      if (*(char *)node->child[1] != '\"') {
        __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x12a,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      local_48.buffer = (ast->lex).source.content + plVar7->offset;
      local_48.length = plVar7->length;
      uVar12 = (ulong)local_48.length;
      local_48.size = 0;
      plVar7 = node->parent;
      cVar1 = *(char *)plVar7;
      if (cVar1 == '\x1c') {
        if (*plVar7->child == node) {
          plVar7 = plVar7->parent;
          if ((plVar7 == (lgx_ast_node_s *)0x0) || (*(char *)plVar7 != '\x0f')) {
            __assert_fail("node->parent->parent && node->parent->parent->type == CATCH_STATEMENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x15c,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
          }
          plVar7 = plVar7->child[1];
LAB_0012246f:
          is_global = false;
          goto LAB_00122471;
        }
        symbol_error(ast,node,"too many paramters\n");
      }
      else if (cVar1 != '\x04') {
        if (cVar1 == '\x1b') {
          plVar7 = plVar7->parent;
          if ((plVar7 == (lgx_ast_node_s *)0x0) || (*(char *)plVar7 != '\x18')) {
            __assert_fail("node->parent->parent && node->parent->parent->type == FUNCTION_DECLARATION"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x14f,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
          }
          plVar7 = plVar7->child[4];
          goto LAB_0012246f;
        }
        if (cVar1 != '\x01') {
          pcVar11 = "[invalid variable declaration] %.*s\n";
          goto LAB_0012235b;
        }
        is_global = plVar7->parent == (lgx_ast_node_s *)0x0;
LAB_00122471:
        plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_VARIABLE,&local_48,is_global);
        if (plVar8 != (lgx_symbol_t *)0x0) {
          plVar9 = &plVar8->type;
          iVar6 = symbol_parse_type(ast,node->child[1],plVar9);
          if (iVar6 == 0) {
            if ((plVar9->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar9), iVar6 != 0))
            goto LAB_0012236e;
            uVar12 = (ulong)local_48.length;
            pcVar11 = "variable %.*s has incomplete type\n";
            goto LAB_0012235b;
          }
        }
      }
    }
    uVar14 = 1;
    goto LAB_0012236e;
  }
  if (node->children != 5) {
    __assert_fail("node->children == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1ae,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  pplVar2 = node->child;
  if (*(char *)*pplVar2 != ',') {
    __assert_fail("node->child[0]->type == FUNCTION_RECEIVER",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1af,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)pplVar2[1] != '#') {
    __assert_fail("node->child[1]->type == IDENTIFIER_TOKEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b0,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)pplVar2[2] != '\x1b') {
    __assert_fail("node->child[2]->type == FUNCTION_DECL_PARAMETER",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b1,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)pplVar2[3] != '\"') {
    __assert_fail("node->child[3]->type == TYPE_EXPRESSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b2,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)pplVar2[4] != '\x01') {
    __assert_fail("node->child[4]->type == BLOCK_STATEMENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b3,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  local_48.buffer = (ast->lex).source.content + pplVar2[1]->offset;
  local_48.length = pplVar2[1]->length;
  local_48.size = 0;
  plVar7 = node->parent;
  if (*(char *)plVar7 == '\x01') {
    uVar10 = 0;
    plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_CONSTANT,&local_48,
                        plVar7->parent == (lgx_ast_node_s *)0x0);
    if (plVar8 != (lgx_symbol_t *)0x0) {
      iVar6 = lgx_type_init(&plVar8->type,T_FUNCTION);
      if (iVar6 == 0) {
        plVar3 = *node->child;
        if (*(char *)plVar3 != ',') {
          pcVar11 = "node->type == FUNCTION_RECEIVER";
          uVar14 = 0x78;
          goto LAB_001228d7;
        }
        if (plVar3->children == 0) {
LAB_00122445:
          local_34 = 0;
        }
        else {
          if (plVar3->children != 1) {
            pcVar11 = "node->children == 1";
            uVar14 = 0x7e;
LAB_001228d7:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,uVar14,
                          "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          plVar7 = *plVar3->child;
          if (*(char *)plVar7 != '\x1b') {
            pcVar11 = "node->child[0]->type == FUNCTION_DECL_PARAMETER";
            uVar14 = 0x7f;
            goto LAB_001228d7;
          }
          if (plVar7->children == 1) {
            plVar7 = *plVar7->child;
            if (*(char *)plVar7 != '\x16') {
              __assert_fail("node->child[0]->child[0]->type == VARIABLE_DECLARATION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x86,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (plVar7->children != 2) {
              __assert_fail("node->child[0]->child[0]->children == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x87,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (*(char *)plVar7->child[1] != '\"') {
              __assert_fail("node->child[0]->child[0]->child[1]->type == TYPE_EXPRESSION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x88,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            plVar9 = &((plVar8->type).u.arr)->value;
            iVar6 = symbol_parse_type(ast,plVar7->child[1],plVar9);
            local_34 = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),1);
            if (iVar6 != 0) goto LAB_001224ee;
            if ((plVar9->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar9), iVar6 != 0))
            goto LAB_00122445;
            pcVar11 = "receiver has incomplete type\n";
          }
          else {
            pcVar11 = "there must be one and only one receiver of a method\n";
          }
          symbol_error(ast,plVar3,pcVar11);
          local_34 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
LAB_001224ee:
        plVar3 = node->child[2];
        if (*(char *)plVar3 != '\x1b') {
          __assert_fail("node->type == FUNCTION_DECL_PARAMETER",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0xb4,
                        "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        plVar4 = (plVar8->type).u.fun;
        uVar14 = plVar3->children;
        uVar12 = (ulong)uVar14;
        if (uVar12 == 0) {
LAB_00122531:
          plVar4->arg_len = uVar14;
          lVar15 = 0;
          bVar5 = 0;
          for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
            plVar7 = plVar3->child[uVar13];
            if (*(char *)plVar7 != '\x16') {
              __assert_fail("node->child[i]->type == VARIABLE_DECLARATION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0xc1,
                            "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (plVar7->children != 2) {
              __assert_fail("node->child[i]->children == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0xc2,
                            "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (*(char *)plVar7->child[1] != '\"') {
              __assert_fail("node->child[i]->child[1]->type == TYPE_EXPRESSION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0xc3,
                            "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            iVar6 = symbol_parse_type(ast,plVar7->child[1],
                                      (lgx_type_t *)((long)&plVar4->args->type + lVar15));
            if (iVar6 != 0) {
              bVar5 = 1;
            }
            if ((*(int *)((long)&plVar4->args->type + lVar15) != 0) &&
               (iVar6 = lgx_type_is_definite((lgx_type_t *)((long)&plVar4->args->type + lVar15)),
               iVar6 == 0)) {
              symbol_error(ast,plVar3,"parameter has incomplete type\n");
              bVar5 = 1;
            }
            uVar12 = (ulong)plVar3->children;
            lVar15 = lVar15 + 0x20;
          }
          uVar14 = (uint)(byte)((byte)local_34 | bVar5);
        }
        else {
          plVar9 = (lgx_type_t *)calloc(uVar12,0x20);
          plVar4->args = plVar9;
          if (plVar9 != (lgx_type_t *)0x0) goto LAB_00122531;
          symbol_error(ast,plVar3,"out of memory\n");
          uVar14 = 1;
        }
        iVar6 = symbol_parse_type_function_return
                          (ast,node->child[3],(lgx_type_function_t *)(plVar8->type).u.arr);
        if (iVar6 == 0) goto LAB_0012236e;
      }
      else {
        symbol_error(ast,node,"out of memory\n");
      }
    }
  }
  else {
    symbol_error(ast,node,"[invalid function declaration] %.*s\n");
  }
  uVar14 = 1;
LAB_0012236e:
  for (uVar12 = 0; uVar12 < node->children; uVar12 = uVar12 + 1) {
    iVar6 = symbol_generate(ast,node->child[uVar12]);
    if (iVar6 != 0) {
      uVar14 = 1;
    }
  }
  return uVar14;
}

Assistant:

static int symbol_generate(lgx_ast_t* ast, lgx_ast_node_t* node) {
    int i, ret = 0;

    switch (node->type) {
        case PACKAGE_DECLARATION:
            break;
        case IMPORT_DECLARATION:
            break;
        case EXPORT_DECLARATION:
            break;
        case VARIABLE_DECLARATION:
            if (symbol_add_variable(ast, node)) {
                ret = 1;
            }
            break;
        case CONSTANT_DECLARATION:
            if (symbol_add_constant(ast, node)) {
                ret = 1;
            }
            break;
        case FUNCTION_DECLARATION:
            if (symbol_add_function(ast, node)) {
                ret = 1;
            }
            break;
        case TYPE_DECLARATION:
            break;
        default: break;
    }

    for (i = 0; i < node->children; ++i) {
        if (symbol_generate(ast, node->child[i])) {
            ret = 1;
        }
    }
    
    return ret;
}